

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ping-pong.cpp
# Opt level: O0

void __thiscall Wall::Wall(Wall *this)

{
  actor_ref *local_68;
  actor_ref local_60;
  int local_54;
  code *pcStack_50;
  int i;
  undefined8 local_48;
  code *local_40;
  undefined8 local_38;
  code *local_20;
  undefined8 local_18;
  Wall *local_10;
  Wall *this_local;
  
  local_10 = this;
  acto::actor::actor(&this->super_actor);
  (this->super_actor)._vptr_actor = (_func_int **)&PTR__Wall_0012a7e0;
  acto::actor_ref::actor_ref(&this->m_console);
  local_68 = this->m_players;
  do {
    acto::actor_ref::actor_ref(local_68);
    local_68 = local_68 + 1;
  } while (local_68 != (actor_ref *)&this->m_counter);
  this->m_counter = 0;
  this->m_finished = false;
  local_20 = do_ball;
  local_18 = 0;
  acto::actor::handler<msg_ball,Wall,msg_ball_const&>(&this->super_actor,0x1071c0);
  local_40 = do_finish;
  local_38 = 0;
  acto::actor::handler<msg_finish,Wall,msg_finish_const&>(&this->super_actor,0x107300);
  pcStack_50 = do_start;
  local_48 = 0;
  acto::actor::handler<msg_start,Wall,msg_start_const&>(&this->super_actor,0x1074f0);
  for (local_54 = 0; local_54 < 10000; local_54 = local_54 + 1) {
    acto::spawn<Player>();
    acto::actor_ref::operator=(this->m_players + local_54,&local_60);
    acto::actor_ref::~actor_ref(&local_60);
  }
  return;
}

Assistant:

Wall()
    : m_counter ( 0 )
    , m_finished( false )
  {
    handler< msg_ball   >( &Wall::do_ball   );
    handler< msg_finish >( &Wall::do_finish );
    handler< msg_start  >( &Wall::do_start  );

    // Инициализация игроков
    for (int i = 0; i < PLAYERS; i++)
      m_players[i] = acto::spawn< Player >();
  }